

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_inter_mode_data_init(TileDataEnc *tile_data)

{
  InterModeRdModel *pIVar1;
  InterModeRdModel *md;
  int i;
  TileDataEnc *tile_data_local;
  
  for (i = 0; i < 0x16; i = i + 1) {
    pIVar1 = tile_data->inter_mode_rd_models + i;
    pIVar1->ready = 0;
    pIVar1->num = 0;
    pIVar1->dist_sum = 0.0;
    pIVar1->ld_sum = 0.0;
    pIVar1->sse_sum = 0.0;
    pIVar1->sse_sse_sum = 0.0;
    pIVar1->sse_ld_sum = 0.0;
  }
  return;
}

Assistant:

void av1_inter_mode_data_init(TileDataEnc *tile_data) {
  for (int i = 0; i < BLOCK_SIZES_ALL; ++i) {
    InterModeRdModel *md = &tile_data->inter_mode_rd_models[i];
    md->ready = 0;
    md->num = 0;
    md->dist_sum = 0;
    md->ld_sum = 0;
    md->sse_sum = 0;
    md->sse_sse_sum = 0;
    md->sse_ld_sum = 0;
  }
}